

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O2

bool __thiscall ON_BrepEdge::Read(ON_BrepEdge *this,ON_BinaryArchive *file)

{
  ON_Interval real_curve_subdomain;
  ON_Interval domain_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int bReversed;
  ON_Interval proxy_domain;
  ON_Interval domain;
  
  bReversed = 0;
  ON_Interval::ON_Interval(&proxy_domain);
  bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_edge_index);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_c3i);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&bReversed);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::ReadInterval(file,&proxy_domain);
        if (bVar1) {
          bVar1 = ON_BinaryArchive::ReadInt(file,2,this->m_vi);
          if (bVar1) {
            bVar1 = ON_BinaryArchive::ReadArray(file,&this->m_ti);
            if (bVar1) {
              bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_tolerance);
              goto LAB_0042c688;
            }
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_0042c688:
  domain.m_t[0] = proxy_domain.m_t[0];
  domain.m_t[1] = proxy_domain.m_t[1];
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  if (2 < iVar3) {
    uVar4 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
    if (bVar1 == true && 0xbeee763 < uVar4) {
      bVar2 = ON_BinaryArchive::ReadInterval(file,&domain);
      bVar1 = true;
      if (!bVar2) {
        domain.m_t[0] = proxy_domain.m_t[0];
        domain.m_t[1] = proxy_domain.m_t[1];
        bVar1 = false;
      }
    }
  }
  real_curve_subdomain.m_t[1] = proxy_domain.m_t[1];
  real_curve_subdomain.m_t[0] = proxy_domain.m_t[0];
  ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,(ON_Curve *)0x0,real_curve_subdomain);
  if (bReversed != 0) {
    ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
  }
  domain_00.m_t[1] = domain.m_t[1];
  domain_00.m_t[0] = domain.m_t[0];
  ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,domain_00);
  return bVar1;
}

Assistant:

bool ON_BrepEdge::Read( ON_BinaryArchive& file )
{
  int bReversed = false;
  ON_Interval proxy_domain;
  bool rc = file.ReadInt( &m_edge_index );
  if (rc) rc = file.ReadInt( &m_c3i );
  if (rc) rc = file.ReadInt( &bReversed );
  if (rc) rc = file.ReadInterval( proxy_domain );
  if (rc) rc = file.ReadInt( 2, m_vi );
  if (rc) rc = file.ReadArray( m_ti );
  if (rc) rc = file.ReadDouble( &m_tolerance );
  ON_Interval domain = proxy_domain;
  if (    file.Archive3dmVersion() >= 3 
       && file.ArchiveOpenNURBSVersion() >= 200206180 )
  {
    if (rc) 
    {
      rc = file.ReadInterval(domain);
      if ( !rc)
        domain = proxy_domain;
    }
  }
  SetProxyCurve( nullptr, proxy_domain );
  if ( bReversed )
    ON_CurveProxy::Reverse();
  SetDomain(domain);

  return rc;
}